

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void srclistRenumberCursors(Parse *pParse,int *aCsrMap,SrcList *pSrc,int iExcept)

{
  int iVar1;
  int in_ECX;
  int *in_RDX;
  Parse *in_RSI;
  long in_RDI;
  Select *p;
  SrcItem *pItem;
  int i;
  long local_30;
  int *piVar2;
  int iVar3;
  
  piVar2 = in_RDX + 2;
  for (iVar3 = 0; iVar3 < *in_RDX; iVar3 = iVar3 + 1) {
    if (iVar3 != in_ECX) {
      if (((*(ushort *)((long)piVar2 + 0x19) >> 7 & 1) == 0) ||
         (*(int *)((long)&in_RSI->db + (long)(piVar2[7] + 1) * 4) == 0)) {
        iVar1 = *(int *)(in_RDI + 0x38);
        *(int *)(in_RDI + 0x38) = iVar1 + 1;
        *(int *)((long)&in_RSI->db + (long)(piVar2[7] + 1) * 4) = iVar1;
      }
      piVar2[7] = *(int *)((long)&in_RSI->db + (long)(piVar2[7] + 1) * 4);
      if ((*(ushort *)((long)piVar2 + 0x19) >> 2 & 1) != 0) {
        for (local_30 = **(long **)(piVar2 + 0x10); local_30 != 0;
            local_30 = *(long *)(local_30 + 0x50)) {
          srclistRenumberCursors
                    (in_RSI,in_RDX,(SrcList *)CONCAT44(in_ECX,iVar3),(int)((ulong)piVar2 >> 0x20));
        }
      }
    }
    piVar2 = piVar2 + 0x12;
  }
  return;
}

Assistant:

static void srclistRenumberCursors(
  Parse *pParse,                  /* Parse context */
  int *aCsrMap,                   /* Array to store cursor mappings in */
  SrcList *pSrc,                  /* FROM clause to renumber */
  int iExcept                     /* FROM clause item to skip */
){
  int i;
  SrcItem *pItem;
  for(i=0, pItem=pSrc->a; i<pSrc->nSrc; i++, pItem++){
    if( i!=iExcept ){
      Select *p;
      assert( pItem->iCursor < aCsrMap[0] );
      if( !pItem->fg.isRecursive || aCsrMap[pItem->iCursor+1]==0 ){
        aCsrMap[pItem->iCursor+1] = pParse->nTab++;
      }
      pItem->iCursor = aCsrMap[pItem->iCursor+1];
      if( pItem->fg.isSubquery ){
        for(p=pItem->u4.pSubq->pSelect; p; p=p->pPrior){
          srclistRenumberCursors(pParse, aCsrMap, p->pSrc, -1);
        }
      }
    }
  }
}